

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O0

void __thiscall CMud::LoadTime(CMud *this)

{
  ulong uVar1;
  long lhour;
  CMud *this_local;
  
  time_info.hour = (int)(((current_time + -0x39f53371) % 0x5a0) / 0x3c);
  time_info.day = (int)(((current_time + -0x39f53371) % 0xa8c0) / 0x5a0);
  time_info.month = (int)(((current_time + -0x39f53371) % 0x7e900) / 0xa8c0);
  time_info.year = (int)((current_time + -0x39f53371) / 0x7e900) + 0x5eb;
  uVar1 = (long)(time_info.month + 1) % 0xc;
  time_info.season =
       (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 3);
  if (time_info.hour < 5) {
    sun = 0;
  }
  else if (time_info.hour < 6) {
    sun = 1;
  }
  else if (time_info.hour < 0x13) {
    sun = 2;
  }
  else if (time_info.hour < 0x14) {
    sun = 3;
  }
  else {
    sun = 0;
  }
  berus_pos = (short)(((current_time + -0x39f53371) % 0x7e90) / 0x5a);
  calabren_pos = (short)(((current_time + -0x39f53371) % 54000) / 0x96);
  return;
}

Assistant:

void CMud::LoadTime()
{
	long lhour;

	lhour = (current_time - 650336715) / (PULSE_TICK / PULSE_PER_SECOND);
	time_info.hour = ((current_time - RS_EPOCH) % (60 * 24)) / (60);
	time_info.day = ((current_time - RS_EPOCH) % (60 * 60 * 12)) / (60 * 24);
	time_info.month = ((current_time - RS_EPOCH) % (60 * 60 * 24 * 6)) / (60 * 60 * 12);
	time_info.year  = 1515 + (current_time - RS_EPOCH) / (60 * 60 * 24 * 6);
	time_info.season= ((time_info.month + 1) % 12) / 3;

	if ( time_info.hour <  5 )
		sun = SolarPosition::Dark;
	else if ( time_info.hour <  6 )
		sun = SolarPosition::Sunrise;
	else if ( time_info.hour < 19 )
		sun = SolarPosition::Daylight;
	else if ( time_info.hour < 20 )
		sun = SolarPosition::Sunset;
	else
		sun = SolarPosition::Dark;

	berus_pos = ((current_time-RS_EPOCH)%(LunarSpeed::Berus*360))/LunarSpeed::Berus;
	calabren_pos = ((current_time-RS_EPOCH)%(LunarSpeed::Calabren*360))/LunarSpeed::Calabren;
}